

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O0

CheckerDeclarationSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::CheckerDeclarationSyntax,slang::syntax::SyntaxList<slang::syntax::AttributeInstanceSyntax>const&,slang::parsing::Token&,slang::parsing::Token&,slang::syntax::AssertionItemPortListSyntax*&,slang::parsing::Token&,slang::syntax::SyntaxList<slang::syntax::MemberSyntax>const&,slang::parsing::Token&,slang::syntax::NamedBlockClauseSyntax*&>
          (BumpAllocator *this,SyntaxList<slang::syntax::AttributeInstanceSyntax> *args,
          Token *args_1,Token *args_2,AssertionItemPortListSyntax **args_3,Token *args_4,
          SyntaxList<slang::syntax::MemberSyntax> *args_5,Token *args_6,
          NamedBlockClauseSyntax **args_7)

{
  Token name;
  Token keyword;
  Token semi;
  Token end;
  CheckerDeclarationSyntax *pCVar1;
  NamedBlockClauseSyntax *in_RCX;
  undefined8 *in_RDX;
  Info *in_R8;
  undefined8 *in_R9;
  undefined8 *in_stack_00000010;
  undefined8 *in_stack_00000018;
  size_t in_stack_ffffffffffffff48;
  size_t in_stack_ffffffffffffff50;
  BumpAllocator *in_stack_ffffffffffffff58;
  CheckerDeclarationSyntax *in_stack_ffffffffffffff70;
  
  pCVar1 = (CheckerDeclarationSyntax *)
           allocate(in_stack_ffffffffffffff58,in_stack_ffffffffffffff50,in_stack_ffffffffffffff48);
  keyword.info = (Info *)*in_R9;
  keyword._0_8_ = in_stack_00000010[1];
  name.info = (Info *)*in_stack_00000010;
  name._0_8_ = pCVar1;
  semi.info = (Info *)*in_RDX;
  semi._0_8_ = (in_RCX->super_SyntaxNode).parent;
  end.info = in_R8;
  end._0_8_ = in_R9;
  slang::syntax::CheckerDeclarationSyntax::CheckerDeclarationSyntax
            (in_stack_ffffffffffffff70,
             (SyntaxList<slang::syntax::AttributeInstanceSyntax> *)*in_stack_00000018,keyword,name,
             *(AssertionItemPortListSyntax **)&in_RCX->super_SyntaxNode,semi,
             (SyntaxList<slang::syntax::MemberSyntax> *)in_RDX[1],end,in_RCX);
  return pCVar1;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }